

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete_visitor.cpp
# Opt level: O1

void __thiscall delete_visitor::visit(delete_visitor *this,MethodDeclaration *ptr)

{
  string *psVar1;
  pointer pcVar2;
  
  (**(ptr->type->super_Base)._vptr_Base)(ptr->type,this);
  (**(ptr->args->super_Base)._vptr_Base)(ptr->args,this);
  (**(ptr->body->super_Base)._vptr_Base)(ptr->body,this);
  psVar1 = ptr->name;
  if (psVar1 != (string *)0x0) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &psVar1->field_2) {
      operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
    }
    operator_delete(psVar1,0x20);
  }
  if (ptr != (MethodDeclaration *)0x0) {
    (*(ptr->super_Declaration).super_Base._vptr_Base[2])(ptr);
    return;
  }
  return;
}

Assistant:

void delete_visitor::visit(MethodDeclaration* ptr) {


    ptr->type->accept(this);
    ptr->args->accept(this);
    ptr->body->accept(this);
    //name
    delete ptr->name;
    delete ptr;
}